

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaGenerator::FindMakeProgram(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  char *pcVar2;
  string local_168;
  uint local_144;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  rep local_c0;
  undefined1 local_b8 [8];
  string error;
  string version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *ninjaCommand;
  cmMakefile *mf_local;
  cmGlobalNinjaGenerator *this_local;
  
  ninjaCommand = (char *)mf;
  mf_local = (cmMakefile *)this;
  bVar1 = cmGlobalGenerator::FindMakeProgram((cmGlobalGenerator *)this,mf);
  pcVar2 = ninjaCommand;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"CMAKE_MAKE_PROGRAM",&local_49);
    pcVar2 = cmMakefile::GetDefinition((cmMakefile *)pcVar2,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (pcVar2 != (char *)0x0) {
      local_28 = pcVar2;
      std::__cxx11::string::operator=((string *)&this->NinjaCommand,pcVar2);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&version.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&this->NinjaCommand);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (version.field_2._M_local_buf + 8),(char (*) [10])"--version");
      std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_b8);
      local_c0 = (rep)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      bVar1 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&version.field_2 + 8),(string *)(error.field_2._M_local_buf + 8),
                         (string *)local_b8,(int *)0x0,(char *)0x0,OUTPUT_NONE,(cmDuration)local_c0,
                         Auto);
      pcVar2 = ninjaCommand;
      if (bVar1) {
        cmSystemTools::TrimWhitespace(&local_168,(string *)((long)&error.field_2 + 8));
        std::__cxx11::string::operator=((string *)&this->NinjaVersion,(string *)&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        CheckNinjaFeatures(this);
      }
      else {
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_140,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&version.field_2 + 8),"\' \'");
        std::operator+(&local_120,"Running\n \'",&local_140);
        std::operator+(&local_100,&local_120,"\'\nfailed with:\n ");
        std::operator+(&local_e0,&local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
        cmMakefile::IssueMessage((cmMakefile *)pcVar2,FATAL_ERROR,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 0;
      }
      local_144 = (uint)!bVar1;
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&version.field_2 + 8));
      if (local_144 != 0) goto LAB_00290dd6;
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00290dd6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalNinjaGenerator::FindMakeProgram(cmMakefile* mf)
{
  if (!this->cmGlobalGenerator::FindMakeProgram(mf)) {
    return false;
  }
  if (const char* ninjaCommand = mf->GetDefinition("CMAKE_MAKE_PROGRAM")) {
    this->NinjaCommand = ninjaCommand;
    std::vector<std::string> command;
    command.push_back(this->NinjaCommand);
    command.emplace_back("--version");
    std::string version;
    std::string error;
    if (!cmSystemTools::RunSingleCommand(command, &version, &error, nullptr,
                                         nullptr,
                                         cmSystemTools::OUTPUT_NONE)) {
      mf->IssueMessage(MessageType::FATAL_ERROR,
                       "Running\n '" + cmJoin(command, "' '") +
                         "'\n"
                         "failed with:\n " +
                         error);
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }
    this->NinjaVersion = cmSystemTools::TrimWhitespace(version);
    this->CheckNinjaFeatures();
  }
  return true;
}